

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O3

exr_result_t internal_exr_apply_zip(exr_encode_pipeline_t *encode)

{
  exr_const_context_t p_Var1;
  exr_result_t eVar2;
  int level;
  uint local_1c;
  ulong local_18;
  
  eVar2 = internal_encode_alloc_buffer
                    (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
                     &encode->scratch_alloc_size_1,encode->packed_bytes);
  if (eVar2 == 0) {
    eVar2 = exr_get_zip_compression_level(encode->context,encode->part_index,(int *)&local_1c);
    if (eVar2 == 0) {
      internal_zip_deconstruct_bytes
                ((uint8_t *)encode->scratch_buffer_1,(uint8_t *)encode->packed_buffer,
                 encode->packed_bytes);
      eVar2 = exr_compress_buffer(encode->context,local_1c,encode->scratch_buffer_1,
                                  encode->packed_bytes,encode->compressed_buffer,
                                  encode->compressed_alloc_size,&local_18);
      if (eVar2 == 0) {
        if (encode->packed_bytes < local_18) {
          memcpy(encode->compressed_buffer,encode->packed_buffer,encode->packed_bytes);
          local_18 = encode->packed_bytes;
        }
        encode->compressed_bytes = local_18;
        eVar2 = 0;
      }
      else {
        p_Var1 = encode->context;
        if (p_Var1 != (exr_const_context_t)0x0) {
          (*p_Var1->print_error)
                    (p_Var1,eVar2,"Unable to compress buffer %lu -> %lu @ level %d",
                     encode->packed_bytes,encode->compressed_alloc_size,(ulong)local_1c);
        }
      }
    }
  }
  else {
    p_Var1 = encode->context;
    if (p_Var1 != (exr_const_context_t)0x0) {
      (*p_Var1->print_error)
                (p_Var1,eVar2,"Unable to allocate scratch buffer for deflate of %lu bytes",
                 encode->packed_bytes);
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_apply_zip (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_const_context_t pctxt = encode->context;
        if (pctxt)
            pctxt->print_error (
                pctxt,
                rv,
                "Unable to allocate scratch buffer for deflate of %" PRIu64
                " bytes",
                encode->packed_bytes);
        return rv;
    }

    return apply_zip_impl (encode);
}